

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse2.c
# Opt level: O0

uint64_t mse_4xh_16bit_highbd_sse2(uint16_t *dst,int dstride,uint16_t *src,int sstride,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint6 uVar3;
  uint in_ECX;
  ulong in_RDX;
  ulong uVar4;
  longlong in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i v;
  __m128i sum_1x64;
  int i;
  __m128i square_result;
  __m128i zeros;
  __m128i sub_result_8x16;
  __m128i res3_4x64;
  __m128i res2_4x64;
  __m128i res1_4x64;
  __m128i res0_4x64;
  __m128i res1_4x32;
  __m128i res0_4x32;
  __m128i dst_8x16;
  __m128i src_8x16;
  __m128i reg1_4x16;
  __m128i reg0_4x16;
  uint64_t sum;
  int local_3ac;
  long local_3a8;
  long lStack_3a0;
  undefined1 local_338 [12];
  short sStack_32c;
  undefined1 local_328 [12];
  short sStack_31c;
  uint64_t local_2d0 [3];
  int local_2b4;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  ulong local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  ulong local_148;
  ulong uStack_140;
  ulong local_138;
  ulong uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  long local_a8;
  undefined8 uStack_a0;
  long local_98;
  long lStack_90;
  long local_88;
  long lStack_80;
  long local_78;
  long lStack_70;
  ulong local_68;
  ulong uStack_60;
  long local_58;
  long lStack_50;
  ulong local_48;
  ulong uStack_40;
  long local_38;
  long lStack_30;
  ulong local_28;
  ulong uStack_20;
  ulong local_18;
  ulong uStack_10;
  
  local_2b4 = (int)in_RSI;
  local_2d0[0] = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_3a8 = 0;
  lStack_3a0 = 0;
  uVar4 = in_RDX;
  for (local_3ac = 0; local_3ac < in_R8D; local_3ac = local_3ac + 2) {
    local_210 = (undefined8 *)(in_RDI + (long)(local_3ac * local_2b4) * 2);
    local_228 = *local_210;
    uStack_220 = 0;
    local_230 = (undefined8 *)(in_RDI + (long)((local_3ac + 1) * local_2b4) * 2);
    local_248 = *local_230;
    uStack_240 = 0;
    uStack_1d0 = 0;
    uStack_1e0 = 0;
    local_250 = (undefined8 *)(in_RDX + (long)(int)(local_3ac * in_ECX) * 2);
    local_268 = *local_250;
    uStack_260 = 0;
    uVar4 = (ulong)in_ECX;
    local_270 = (undefined8 *)(in_RDX + (long)(int)((local_3ac + 1) * in_ECX) * 2);
    local_288 = *local_270;
    uStack_280 = 0;
    uStack_1f0 = 0;
    uStack_200 = 0;
    local_1b8._0_2_ = (short)local_268;
    local_1b8._2_2_ = (short)((ulong)local_268 >> 0x10);
    local_1b8._4_2_ = (short)((ulong)local_268 >> 0x20);
    local_1b8._6_2_ = (short)((ulong)local_268 >> 0x30);
    uStack_1b0._0_2_ = (short)local_288;
    uStack_1b0._2_2_ = (short)((ulong)local_288 >> 0x10);
    uStack_1b0._4_2_ = (short)((ulong)local_288 >> 0x20);
    uStack_1b0._6_2_ = (short)((ulong)local_288 >> 0x30);
    local_1c8._0_2_ = (short)local_228;
    local_1c8._2_2_ = (short)((ulong)local_228 >> 0x10);
    local_1c8._4_2_ = (short)((ulong)local_228 >> 0x20);
    local_1c8._6_2_ = (short)((ulong)local_228 >> 0x30);
    uStack_1c0._0_2_ = (short)local_248;
    uStack_1c0._2_2_ = (short)((ulong)local_248 >> 0x10);
    uStack_1c0._4_2_ = (short)((ulong)local_248 >> 0x20);
    uStack_1c0._6_2_ = (short)((ulong)local_248 >> 0x30);
    local_328._0_2_ = (short)local_1b8 - (short)local_1c8;
    local_328._4_2_ = local_1b8._2_2_ - local_1c8._2_2_;
    local_328._8_2_ = local_1b8._4_2_ - local_1c8._4_2_;
    sStack_31c = local_1b8._6_2_ - local_1c8._6_2_;
    local_338._0_2_ = (short)uStack_1b0 - (short)uStack_1c0;
    local_338._4_2_ = uStack_1b0._2_2_ - uStack_1c0._2_2_;
    local_338._8_2_ = uStack_1b0._4_2_ - uStack_1c0._4_2_;
    sStack_32c = uStack_1b0._6_2_ - uStack_1c0._6_2_;
    local_198 = CONCAT26(sStack_31c,
                         CONCAT24(local_328._8_2_,CONCAT22(local_328._4_2_,local_328._0_2_)));
    uStack_190 = CONCAT26(sStack_32c,
                          CONCAT24(local_338._8_2_,CONCAT22(local_338._4_2_,local_338._0_2_)));
    local_1a8 = 0;
    uStack_1a0 = 0;
    local_328._2_2_ = 0;
    local_328._6_2_ = 0;
    local_328._10_2_ = 0;
    local_178 = CONCAT26(sStack_31c,
                         CONCAT24(local_328._8_2_,CONCAT22(local_328._4_2_,local_328._0_2_)));
    uStack_170 = CONCAT26(sStack_32c,
                          CONCAT24(local_338._8_2_,CONCAT22(local_338._4_2_,local_338._0_2_)));
    local_188 = 0;
    uStack_180 = 0;
    local_338._2_2_ = 0;
    local_338._6_2_ = 0;
    local_338._10_2_ = 0;
    local_148 = local_328._0_8_;
    uVar3 = local_328._8_6_;
    stack0xfffffffffffffce0 = (ulong)uVar3;
    uStack_140 = stack0xfffffffffffffce0;
    auVar2._8_6_ = uVar3;
    auVar2._0_8_ = local_328._0_8_;
    auVar2._14_2_ = 0;
    auVar5._8_6_ = uVar3;
    auVar5._0_8_ = local_328._0_8_;
    auVar5._14_2_ = 0;
    auVar5 = pmaddwd(auVar2,auVar5);
    local_168 = local_338._0_8_;
    uVar3 = local_338._8_6_;
    stack0xfffffffffffffcd0 = (ulong)uVar3;
    uStack_160 = stack0xfffffffffffffcd0;
    auVar1._8_6_ = uVar3;
    auVar1._0_8_ = local_338._0_8_;
    auVar1._14_2_ = 0;
    auVar6._8_6_ = uVar3;
    auVar6._0_8_ = local_338._0_8_;
    auVar6._14_2_ = 0;
    auVar6 = pmaddwd(auVar1,auVar6);
    local_328._0_8_ = auVar5._0_8_;
    stack0xfffffffffffffce0 = auVar5._8_8_;
    uStack_f0 = stack0xfffffffffffffce0;
    local_108 = 0;
    uStack_100 = 0;
    local_f8._0_4_ = auVar5._0_4_;
    local_f8._4_4_ = auVar5._4_4_;
    local_b8 = local_328._0_8_;
    local_c8 = 0;
    uStack_c0 = 0;
    uStack_b0._0_4_ = auVar5._8_4_;
    uStack_b0._4_4_ = auVar5._12_4_;
    local_338._0_8_ = auVar6._0_8_;
    stack0xfffffffffffffcd0 = auVar6._8_8_;
    uStack_110 = stack0xfffffffffffffcd0;
    local_128 = 0;
    uStack_120 = 0;
    local_118._0_4_ = auVar6._0_4_;
    local_118._4_4_ = auVar6._4_4_;
    local_d8 = local_338._0_8_;
    local_e8 = 0;
    uStack_e0 = 0;
    uStack_d0._0_4_ = auVar6._8_4_;
    uStack_d0._4_4_ = auVar6._12_4_;
    local_78 = local_3a8;
    lStack_70 = lStack_3a0;
    local_18 = (ulong)(uint)local_f8;
    uStack_10 = (ulong)local_f8._4_4_;
    local_28 = (ulong)(uint)uStack_b0;
    uStack_20 = (ulong)uStack_b0._4_4_;
    local_38 = local_18 + local_28;
    lStack_30 = uStack_10 + uStack_20;
    local_48 = (ulong)(uint)local_118;
    uStack_40 = (ulong)local_118._4_4_;
    local_58 = local_38 + local_48;
    lStack_50 = lStack_30 + uStack_40;
    local_68 = (ulong)(uint)uStack_d0;
    uStack_60 = (ulong)uStack_d0._4_4_;
    local_88 = local_58 + local_68;
    lStack_80 = lStack_50 + uStack_60;
    local_3a8 = local_3a8 + local_88;
    lStack_3a0 = lStack_3a0 + lStack_80;
    local_208 = local_288;
    local_1f8 = local_268;
    local_1e8 = local_248;
    local_1d8 = local_228;
    local_1c8 = local_228;
    uStack_1c0 = local_248;
    local_1b8 = local_268;
    uStack_1b0 = local_288;
    local_158 = local_168;
    uStack_150 = uStack_160;
    local_138 = local_148;
    uStack_130 = uStack_140;
    local_118 = local_338._0_8_;
    local_f8 = local_328._0_8_;
    uStack_d0 = stack0xfffffffffffffcd0;
    uStack_b0 = stack0xfffffffffffffce0;
  }
  local_98 = local_3a8;
  lStack_90 = lStack_3a0;
  local_a8 = lStack_3a0;
  uStack_a0 = 0;
  v[1] = uVar4;
  v[0] = in_RSI;
  xx_storel_64(local_2d0,v);
  return local_2d0[0];
}

Assistant:

static uint64_t mse_4xh_16bit_highbd_sse2(uint16_t *dst, int dstride,
                                          uint16_t *src, int sstride, int h) {
  uint64_t sum = 0;
  __m128i reg0_4x16, reg1_4x16;
  __m128i src_8x16;
  __m128i dst_8x16;
  __m128i res0_4x32, res1_4x32, res0_4x64, res1_4x64, res2_4x64, res3_4x64;
  __m128i sub_result_8x16;
  const __m128i zeros = _mm_setzero_si128();
  __m128i square_result = _mm_setzero_si128();
  for (int i = 0; i < h; i += 2) {
    reg0_4x16 = _mm_loadl_epi64((__m128i const *)(&dst[(i + 0) * dstride]));
    reg1_4x16 = _mm_loadl_epi64((__m128i const *)(&dst[(i + 1) * dstride]));
    dst_8x16 = _mm_unpacklo_epi64(reg0_4x16, reg1_4x16);

    reg0_4x16 = _mm_loadl_epi64((__m128i const *)(&src[(i + 0) * sstride]));
    reg1_4x16 = _mm_loadl_epi64((__m128i const *)(&src[(i + 1) * sstride]));
    src_8x16 = _mm_unpacklo_epi64(reg0_4x16, reg1_4x16);

    sub_result_8x16 = _mm_sub_epi16(src_8x16, dst_8x16);

    res0_4x32 = _mm_unpacklo_epi16(sub_result_8x16, zeros);
    res1_4x32 = _mm_unpackhi_epi16(sub_result_8x16, zeros);

    res0_4x32 = _mm_madd_epi16(res0_4x32, res0_4x32);
    res1_4x32 = _mm_madd_epi16(res1_4x32, res1_4x32);

    res0_4x64 = _mm_unpacklo_epi32(res0_4x32, zeros);
    res1_4x64 = _mm_unpackhi_epi32(res0_4x32, zeros);
    res2_4x64 = _mm_unpacklo_epi32(res1_4x32, zeros);
    res3_4x64 = _mm_unpackhi_epi32(res1_4x32, zeros);

    square_result = _mm_add_epi64(
        square_result,
        _mm_add_epi64(
            _mm_add_epi64(_mm_add_epi64(res0_4x64, res1_4x64), res2_4x64),
            res3_4x64));
  }

  const __m128i sum_1x64 =
      _mm_add_epi64(square_result, _mm_srli_si128(square_result, 8));
  xx_storel_64(&sum, sum_1x64);
  return sum;
}